

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

int Gia_ManEquivCheckLits(Gia_Man_t *p,int nLits)

{
  int iVar1;
  
  iVar1 = Gia_ManEquivCountLitsAll(p);
  if (iVar1 - nLits != 0) {
    Abc_Print(1,"Detected a mismatch in counting equivalence classes (%d).\n",
              (ulong)(uint)(iVar1 - nLits));
  }
  return 1;
}

Assistant:

int Gia_ManEquivCheckLits( Gia_Man_t * p, int nLits )
{
    int nLitsReal = Gia_ManEquivCountLitsAll( p );
    if ( nLitsReal != nLits )
        Abc_Print( 1, "Detected a mismatch in counting equivalence classes (%d).\n", nLitsReal - nLits );
    return 1;
}